

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# natpmp.cpp
# Opt level: O0

void __thiscall libtorrent::natpmp::resend_request(natpmp *this,port_mapping_t i)

{
  bool bVar1;
  value_type *pvVar2;
  int local_3c;
  duration<long,_std::ratio<3600L,_1L>_> local_38;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_30;
  duration local_28;
  int local_20;
  strong_typedef<int,_libtorrent::port_mapping_tag,_void> local_1c;
  natpmp *local_18;
  natpmp *this_local;
  port_mapping_t i_local;
  
  local_18 = this;
  this_local._4_4_ = i.m_val;
  bVar1 = libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>::operator!=
                    (&this->m_currently_mapping,
                     (strong_typedef<int,_libtorrent::port_mapping_tag,_void> *)
                     ((long)&this_local + 4));
  if (!bVar1) {
    if ((this->m_retry_count < 9) && ((this->m_abort & 1U) == 0)) {
      send_map_request(this,this_local._4_4_);
    }
    else {
      libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>::strong_typedef
                (&local_1c,-1);
      (this->m_currently_mapping).m_val = local_1c.m_val;
      local_20 = this_local._4_4_;
      pvVar2 = libtorrent::aux::
               container_wrapper<libtorrent::natpmp::mapping_t,_libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>,_std::vector<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>_>
               ::operator[](&this->m_mappings,
                            (strong_typedef<int,_libtorrent::port_mapping_tag,_void>)
                            this_local._4_4_);
      (pvVar2->super_base_mapping).act = none;
      local_30.__d.__r = (duration)libtorrent::aux::time_now();
      local_3c = 2;
      ::std::chrono::duration<long,std::ratio<3600l,1l>>::duration<int,void>
                ((duration<long,std::ratio<3600l,1l>> *)&local_38,&local_3c);
      local_28.__r = (rep)::std::chrono::operator+(&local_30,&local_38);
      pvVar2 = libtorrent::aux::
               container_wrapper<libtorrent::natpmp::mapping_t,_libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>,_std::vector<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>_>
               ::operator[](&this->m_mappings,
                            (strong_typedef<int,_libtorrent::port_mapping_tag,_void>)
                            this_local._4_4_);
      (pvVar2->super_base_mapping).expires.__d.__r = local_28.__r;
      try_next_mapping(this,this_local._4_4_);
    }
  }
  return;
}

Assistant:

void natpmp::resend_request(port_mapping_t const i)
{
	if (m_currently_mapping != i) return;

	// if we're shutting down, don't retry, just move on
	// to the next mapping
	if (m_retry_count >= 9 || m_abort)
	{
		m_currently_mapping = port_mapping_t{-1};
		m_mappings[i].act = portmap_action::none;
		// try again in two hours
		m_mappings[i].expires = aux::time_now() + hours(2);
		try_next_mapping(i);
		return;
	}
	send_map_request(i);
}